

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::PrintTestPartResultToString_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TestPartResult *test_part_result)

{
  size_t sVar1;
  string *extraout_RAX;
  string *psVar2;
  int in_ECX;
  internal *this_00;
  ostream *poVar3;
  char *pcVar4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  string local_40;
  
  Message::Message((Message *)&local_48);
  this_00 = *(internal **)(this + 0x10);
  if (this_00 != (internal *)0x0) {
    this_00 = *(internal **)(this + 8);
  }
  FormatFileLocation_abi_cxx11_(&local_40,this_00,(char *)(ulong)*(uint *)(this + 0x28),in_ECX);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_48.ptr_ + 0x10),local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_48.ptr_ + 0x10)," ",1);
  if ((ulong)*(uint *)this < 3) {
    pcVar4 = &DAT_0016bd00 + *(int *)(&DAT_0016bd00 + (ulong)*(uint *)this * 4);
  }
  else {
    pcVar4 = "Unknown result type";
  }
  poVar3 = (ostream *)(local_48.ptr_ + 0x10);
  sVar1 = strlen(pcVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar1);
  pcVar4 = *(char **)(this + 0x50);
  poVar3 = (ostream *)(local_48.ptr_ + 0x10);
  if (pcVar4 == (char *)0x0) {
    sVar1 = 6;
    pcVar4 = "(null)";
  }
  else {
    sVar1 = strlen(pcVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar1);
  StringStreamToString(__return_storage_ptr__,local_48.ptr_);
  psVar2 = (string *)&local_40.field_2;
  if ((string *)local_40._M_dataplus._M_p != psVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    psVar2 = extraout_RAX;
  }
  if (local_48.ptr_ != (stringstream *)0x0) {
    psVar2 = (string *)(**(code **)(*(long *)local_48.ptr_ + 8))();
  }
  return psVar2;
}

Assistant:

static std::string PrintTestPartResultToString(
    const TestPartResult& test_part_result) {
  return (Message()
          << internal::FormatFileLocation(test_part_result.file_name(),
                                          test_part_result.line_number())
          << " " << TestPartResultTypeToString(test_part_result.type())
          << test_part_result.message()).GetString();
}